

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O1

Vec_Wrd_t * Bdc_SpfdDecomposeTest__(Vec_Int_t **pvWeights)

{
  long lVar1;
  Vec_Int_t *__ptr;
  int iVar2;
  int iVar3;
  Bdc_Ent_t *p;
  ulong uVar4;
  Vec_Wrd_t *pVVar5;
  word *__s;
  Vec_Int_t *pVVar6;
  int *piVar7;
  uint *puVar8;
  word wVar9;
  FILE *pFVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  Bdc_Ent_t *pBVar16;
  ulong uVar17;
  int iVar18;
  Bdc_Ent_t *pBVar19;
  uint uVar20;
  word wVar21;
  long lVar22;
  Bdc_Ent_t *pBVar23;
  timespec ts;
  timespec local_d8;
  Vec_Int_t *local_c8;
  Vec_Int_t *local_c0;
  Vec_Wrd_t *local_b8;
  long local_b0;
  ulong local_a8;
  long local_a0;
  long local_98;
  long local_90;
  Bdc_Ent_t *local_88;
  Bdc_Ent_t *local_80;
  Vec_Int_t **local_78;
  ulong local_70;
  Bdc_Ent_t *local_68;
  long local_60;
  long local_58;
  Bdc_Ent_t *local_50;
  Bdc_Ent_t *local_48;
  ulong local_40;
  ulong local_38;
  
  local_78 = pvWeights;
  iVar2 = clock_gettime(3,&local_d8);
  if (iVar2 < 0) {
    local_98 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_d8.tv_nsec),8);
    local_98 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_d8.tv_sec * -1000000;
  }
  printf("Allocating %.2f MB of internal memory.\n",0x40b65a0bc0000000);
  p = (Bdc_Ent_t *)calloc(250000000,0x18);
  *(undefined4 *)p = 0xffffffff;
  *(undefined4 *)&p->field_0x4 = 0xffffffff;
  p->iNext = -1;
  p->iList = -1;
  p->Truth = 0xffffffffffffffff;
  p->iList = 0;
  uVar4 = 0xffffffffffffffe8;
  do {
    *(undefined4 *)((long)&p[1].iList + uVar4) = 0;
    uVar4 = uVar4 + 0x18;
  } while (uVar4 < 0x165a0bbe8);
  lVar22 = 0;
  uVar14 = 1;
  printf("Added %d + %d + 0 = %d. Total = %8d.\n",0,0,0,1);
  pVVar5 = (Vec_Wrd_t *)malloc(0x10);
  pVVar5->nCap = 250000000;
  pVVar5->nSize = 0;
  __s = (word *)malloc(2000000000);
  pVVar5->pArray = __s;
  pVVar5->nSize = 250000000;
  memset(__s,0,2000000000);
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 250000000;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(1000000000);
  pVVar6->pArray = piVar7;
  pVVar6->nSize = 250000000;
  memset(piVar7,0,1000000000);
  pVVar5->nSize = 0;
  pVVar6->nSize = 0;
  local_c0 = pVVar6;
  local_b8 = pVVar5;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 0x10;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(0x40);
  pVVar6->pArray = piVar7;
  local_c8 = pVVar6;
  Vec_IntPush(pVVar6,1);
  pBVar23 = p + 1;
  lVar12 = 0x1fffffff;
  do {
    *(ulong *)pBVar23 = (*(ulong *)pBVar23 & 0xe0000000e0000000) + lVar12;
    wVar9 = *(word *)((long)Truths + lVar22);
    pBVar23->Truth = wVar9;
    puVar8 = (uint *)Bdc_SpfdHashLookup(p,0xc000013,wVar9);
    *puVar8 = uVar14;
    Vec_WrdPush(local_b8,wVar9);
    Vec_IntPush(local_c0,0);
    pVVar6 = local_c8;
    pBVar23 = pBVar23 + 1;
    lVar12 = lVar12 + 0x100000000;
    lVar22 = lVar22 + 8;
    uVar14 = uVar14 + 1;
  } while (lVar22 != 0x30);
  Vec_IntPush(local_c8,7);
  printf("Added %d + %d + 0 = %d. Total = %8d.\n",0,0,0,(ulong)uVar14);
  local_a0 = 0;
  do {
    lVar12 = local_a0;
    uVar4 = 0;
    lVar22 = local_a0 + 1;
    local_90 = local_a0;
    do {
      local_a0 = lVar22;
      uVar17 = uVar4 + 1;
      uVar11 = 0;
      local_a8 = uVar4;
      local_70 = uVar17;
      do {
        if (uVar4 <= uVar11 && uVar11 + uVar4 == lVar12) {
          lVar12 = (long)pVVar6->nSize;
          if ((((lVar12 <= (long)uVar4) || (lVar12 <= (long)uVar17)) || (lVar12 <= (long)uVar11)) ||
             (lVar12 <= (long)(uVar11 + 1))) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar7 = pVVar6->pArray;
          lVar12 = (long)piVar7[uVar4];
          iVar2 = piVar7[uVar17];
          lVar22 = (long)piVar7[uVar11];
          iVar18 = piVar7[uVar11 + 1];
          iVar3 = clock_gettime(3,&local_d8);
          if (iVar3 < 0) {
            local_b0 = 1;
          }
          else {
            lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_d8.tv_nsec),8);
            local_b0 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_d8.tv_sec * -1000000;
          }
          lVar13 = (long)iVar2 * 0x18;
          lVar1 = (long)iVar18 * 0x18;
          printf("Trying %7d  x %7d.  ",
                 (ulong)(uint)((int)((ulong)(lVar13 + lVar12 * -0x18) >> 3) * -0x55555555),
                 (ulong)(uint)((int)((ulong)(lVar1 + lVar22 * -0x18) >> 3) * -0x55555555));
          uVar4 = local_a8;
          if (lVar13 != lVar12 * 0x18 &&
              SBORROW8(lVar13,lVar12 * 0x18) == lVar13 + lVar12 * -0x18 < 0) {
            pBVar16 = p + lVar12;
            local_50 = p + iVar2;
            local_68 = p + lVar22;
            local_48 = p + iVar18;
            local_60 = lVar1;
            local_58 = lVar22 * 0x18;
            do {
              if (local_58 < local_60) {
                local_40 = (ulong)(((uint)((int)pBVar16 - (int)p) >> 3) * -0x55555555 & 0x1fffffff);
                pBVar19 = local_68;
                local_88 = pBVar16;
                do {
                  if ((uVar4 < uVar11) || (pBVar16 < pBVar19)) {
                    local_38 = ((ulong)((long)pBVar19 - (long)p) >> 3) * -0x5555555500000000 &
                               0x1fffffff00000000;
                    uVar14 = 0;
                    uVar4 = 0;
                    local_80 = pBVar19;
                    do {
                      if ((uVar4 & 1) == 0) {
                        wVar9 = pBVar16->Truth;
                      }
                      else {
                        wVar9 = ~pBVar16->Truth;
                      }
                      if ((uVar4 & 2) == 0) {
                        wVar21 = pBVar19->Truth;
                      }
                      else {
                        wVar21 = ~pBVar19->Truth;
                      }
                      uVar17 = wVar21 & wVar9;
                      if ((int)uVar4 == 4) {
                        uVar17 = wVar21 ^ wVar9;
                      }
                      uVar15 = -(ulong)((uint)uVar17 & 1);
                      if (uVar17 != uVar15) {
                        uVar15 = uVar15 ^ uVar17;
                        piVar7 = Bdc_SpfdHashLookup(p,0xc000013,uVar15);
                        pBVar16 = local_88;
                        pBVar19 = local_80;
                        if (piVar7 != (int *)0x0) {
                          pBVar23->Truth = uVar15;
                          *(ulong *)pBVar23 =
                               ((uVar4 >> 2) << 0x3e | uVar14 & 0x20000000 | local_38 |
                                (ulong)((uint)(uVar4 >> 1) & 1) << 0x3d |
                               (*(ulong *)pBVar23 & 0x8000000080000000) + local_40) &
                               0xffffffffbfffffff | (ulong)(((uint)uVar17 & 1) << 0x1e);
                          *piVar7 = (int)((ulong)((long)pBVar23 - (long)p) >> 3) * -0x55555555;
                          pBVar23 = pBVar23 + 1;
                          Vec_WrdPush(local_b8,uVar15);
                          Vec_IntPush(local_c0,(int)local_a0);
                          pBVar16 = local_88;
                          pBVar19 = local_80;
                          if ((long)pBVar23 - (long)p == 6000000000) {
                            printf("Reached limit of %d functions.\n",250000000);
                            pVVar5 = local_b8;
                            pVVar6 = local_c0;
                            goto LAB_00529da4;
                          }
                        }
                      }
                      uVar20 = (int)uVar4 + 1;
                      uVar4 = (ulong)uVar20;
                      uVar14 = uVar14 + 0x20000000;
                    } while (uVar20 != 5);
                  }
                  pBVar19 = pBVar19 + 1;
                  uVar4 = local_a8;
                } while (pBVar19 < local_48);
              }
              pBVar16 = pBVar16 + 1;
            } while (pBVar16 < local_50);
          }
          printf("Added %d + %d + 1 = %d. Total = %8d.   ",uVar4 & 0xffffffff,uVar11,local_a0,
                 (ulong)(uint)((int)((ulong)((long)pBVar23 - (long)p) >> 3) * -0x55555555));
          iVar18 = 3;
          iVar2 = clock_gettime(3,&local_d8);
          lVar12 = local_90;
          pVVar6 = local_c8;
          if (iVar2 < 0) {
            lVar22 = -1;
          }
          else {
            lVar22 = local_d8.tv_nsec / 1000 + local_d8.tv_sec * 1000000;
          }
          lVar22 = lVar22 + local_b0;
          Abc_Print(iVar18,"%s =","Time");
          Abc_Print(iVar18,"%9.2f sec\n",(double)lVar22 / 1000000.0);
          uVar17 = local_70;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != 6);
      uVar4 = uVar17;
      lVar22 = local_a0;
    } while (uVar17 != 6);
    Vec_IntPush(pVVar6,(int)((ulong)((long)pBVar23 - (long)p) >> 3) * -0x55555555);
  } while (local_a0 != 6);
  iVar18 = 3;
  iVar2 = clock_gettime(3,&local_d8);
  if (iVar2 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = local_d8.tv_nsec / 1000 + local_d8.tv_sec * 1000000;
  }
  lVar12 = lVar12 + local_98;
  Abc_Print(iVar18,"%s =","Time");
  Abc_Print(iVar18,"%9.2f sec\n",(double)lVar12 / 1000000.0);
  pFVar10 = fopen("func6v6n_bin.txt","wb");
  pVVar5 = local_b8;
  fwrite(local_b8->pArray,8,(long)local_b8->nSize,pFVar10);
  fclose(pFVar10);
  pFVar10 = fopen("func6v6nW_bin.txt","wb");
  pVVar6 = local_c0;
  fwrite(local_c0->pArray,4,(long)local_c0->nSize,pFVar10);
  fclose(pFVar10);
LAB_00529da4:
  __ptr = local_c8;
  if (local_c8->pArray != (int *)0x0) {
    free(local_c8->pArray);
    __ptr->pArray = (int *)0x0;
  }
  free(__ptr);
  free(p);
  *local_78 = pVVar6;
  return pVVar5;
}

Assistant:

Vec_Wrd_t * Bdc_SpfdDecomposeTest__( Vec_Int_t ** pvWeights )
{
//    int nFuncs = 8000000; // the number of functions to compute
//    int nSize  = 2777111; // the hash table size to use
//    int Limit  = 6;
    
//    int nFuncs = 51000000; // the number of functions to compute
//    int nSize  = 50331653; // the hash table size to use
//    int Limit  = 6;
    
    int nFuncs = 250000000; // the number of functions to compute
    int nSize  = 201326611; // the hash table size to use
    int Limit  = 6;

    int * pPlace, i, n, m, k, s, fCompl;
    abctime clk = Abc_Clock(), clk2;
    Vec_Int_t * vStops;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vWeights;
    Bdc_Ent_t * p, * q, * pBeg0, * pEnd0, * pBeg1, * pEnd1, * pThis0, * pThis1;
    word t0, t1, t;
    assert( nSize <= nFuncs );

    printf( "Allocating %.2f MB of internal memory.\n", 1.0*sizeof(Bdc_Ent_t)*nFuncs/(1<<20) );

    p = (Bdc_Ent_t *)calloc( nFuncs, sizeof(Bdc_Ent_t) );
    memset( p, 255, sizeof(Bdc_Ent_t) );
    p->iList = 0;
    for ( q = p; q < p+nFuncs; q++ )
       q->iList = 0;
    q = p + 1;
    printf( "Added %d + %d + 0 = %d. Total = %8d.\n", 0, 0, 0, (int)(q-p) );

    vTruths  = Vec_WrdStart( nFuncs );
    vWeights = Vec_IntStart( nFuncs );
    Vec_WrdClear( vTruths );
    Vec_IntClear( vWeights );

    // create elementary vars
    vStops = Vec_IntAlloc( 10 );
    Vec_IntPush( vStops, 1 );
    for ( i = 0; i < 6; i++ )
    {
        q->iFan0 = BDC_TERM;
        q->iFan1 = i;
        q->Truth = Truths[i];
        pPlace   = Bdc_SpfdHashLookup( p, nSize, q->Truth );
        *pPlace  = q-p;
        q++;
        Vec_WrdPush( vTruths, Truths[i] );
        Vec_IntPush( vWeights, 0 );
    }
    Vec_IntPush( vStops, 7 );
    printf( "Added %d + %d + 0 = %d. Total = %8d.\n", 0, 0, 0, (int)(q-p) );

    // create gates
    for ( n = 0; n < Limit; n++ )
    {
        // try previous
        for ( k = 0; k < Limit; k++ )
        for ( m = 0; m < Limit; m++ )
        {
            if ( k + m != n || k > m )
                continue;
            // set the start and stop
            pBeg0 = p + Vec_IntEntry( vStops, k );
            pEnd0 = p + Vec_IntEntry( vStops, k+1 );
            // set the start and stop
            pBeg1 = p + Vec_IntEntry( vStops, m );
            pEnd1 = p + Vec_IntEntry( vStops, m+1 );

            clk2 = Abc_Clock();
            printf( "Trying %7d  x %7d.  ", (int)(pEnd0-pBeg0), (int)(pEnd1-pBeg1) );
            for ( pThis0 = pBeg0; pThis0 < pEnd0; pThis0++ )
            for ( pThis1 = pBeg1; pThis1 < pEnd1; pThis1++ )
            if ( k < m || pThis1 > pThis0 )
//            if ( n < 5 || Bdc_SpfdCheckOverlap(p, pThis0, pThis1) )
            for ( s = 0; s < 5; s++ )
            {
                t0 = (s&1)      ? ~pThis0->Truth : pThis0->Truth;
                t1 = ((s>>1)&1) ? ~pThis1->Truth : pThis1->Truth;
                t  = ((s>>2)&1) ? t0 ^ t1 : t0 & t1;
                fCompl = t & 1;
                if ( fCompl )
                    t = ~t;
                if ( t == 0 )
                    continue;
                pPlace = Bdc_SpfdHashLookup( p, nSize, t );
                if ( pPlace == NULL )
                    continue;
                q->iFan0   = pThis0-p;
                q->fCompl0 = s&1;
                q->iFan1   = pThis1-p;
                q->fCompl1 = (s>>1)&1;
                q->fExor   = (s>>2)&1;
                q->Truth   = t;
                q->fCompl  = fCompl;
                *pPlace = q-p;
                q++;
                Vec_WrdPush( vTruths, t );
//                Vec_IntPush( vWeights, n == 5 ? n : n+1 );
                Vec_IntPush( vWeights, n+1 );
                if ( q-p == nFuncs )
                {
                    printf( "Reached limit of %d functions.\n", nFuncs );
                    goto finish;
                }
            }
            printf( "Added %d + %d + 1 = %d. Total = %8d.   ", k, m, n+1, (int)(q-p) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk2 );
        }
        Vec_IntPush( vStops, q-p );
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );


    {
        FILE * pFile = fopen( "func6v6n_bin.txt", "wb" );
        fwrite( Vec_WrdArray(vTruths), sizeof(word), Vec_WrdSize(vTruths), pFile );
        fclose( pFile );
    }
    {
        FILE * pFile = fopen( "func6v6nW_bin.txt", "wb" );
        fwrite( Vec_IntArray(vWeights), sizeof(int), Vec_IntSize(vWeights), pFile );
        fclose( pFile );
    }


finish:
    Vec_IntFree( vStops );
    free( p );

    *pvWeights = vWeights;
//    Vec_WrdFree( vTruths );
    return vTruths;
}